

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O0

int32_t icu_63::number::impl::AffixUtils::unescapedCodePointCount
                  (UnicodeString *affixPattern,SymbolProvider *provider,UErrorCode *status)

{
  bool bVar1;
  UBool UVar2;
  int32_t iVar3;
  int iVar4;
  UErrorCode *in_R8;
  AffixTag AVar5;
  UnicodeString local_a0;
  AffixUtils *local_5c;
  undefined1 local_54 [8];
  undefined1 local_4c [16];
  undefined8 local_3c;
  AffixTag tag;
  int32_t length;
  UErrorCode *status_local;
  SymbolProvider *provider_local;
  UnicodeString *affixPattern_local;
  
  tag.state = STATE_BASE;
  unique0x100000f1 = (UnicodeString *)status;
  AffixTag::AffixTag((AffixTag *)&local_3c);
  while( true ) {
    bVar1 = hasNext((AffixTag *)&local_3c,affixPattern);
    if (!bVar1) {
      return tag.state;
    }
    local_5c = local_3c;
    local_54._0_4_ = tag.offset;
    local_54._4_4_ = tag.codePoint;
    AVar5._8_8_ = affixPattern;
    AVar5.offset = tag.offset;
    AVar5.codePoint = tag.codePoint;
    AVar5 = nextToken(local_3c,AVar5,stack0xffffffffffffffd8,in_R8);
    local_4c._0_8_ = AVar5._0_8_;
    local_3c = (AffixUtils *)local_4c._0_8_;
    local_4c._8_8_ = AVar5._8_8_;
    tag.offset = local_4c._8_4_;
    tag.codePoint = local_4c._12_4_;
    local_4c = (undefined1  [16])AVar5;
    UVar2 = ::U_FAILURE(*(UErrorCode *)
                         &(stack0xffffffffffffffd8->super_Replaceable).super_UObject._vptr_UObject);
    if (UVar2 != '\0') break;
    if (tag.codePoint == -0xf) {
      tag.state = tag.state + STATE_FIRST_QUOTE;
    }
    else if ((long)tag._0_8_ < 0) {
      (*provider->_vptr_SymbolProvider[2])(&local_a0,provider,(ulong)(uint)tag.codePoint);
      iVar3 = UnicodeString::length(&local_a0);
      tag.state = iVar3 + tag.state;
      UnicodeString::~UnicodeString(&local_a0);
    }
    else {
      iVar4 = 2;
      if (local_3c._4_4_ < 0x10000) {
        iVar4 = 1;
      }
      tag.state = iVar4 + tag.state;
    }
  }
  return tag.state;
}

Assistant:

int32_t AffixUtils::unescapedCodePointCount(const UnicodeString &affixPattern,
                                            const SymbolProvider &provider, UErrorCode &status) {
    int32_t length = 0;
    AffixTag tag;
    while (hasNext(tag, affixPattern)) {
        tag = nextToken(tag, affixPattern, status);
        if (U_FAILURE(status)) { return length; }
        if (tag.type == TYPE_CURRENCY_OVERFLOW) {
            length += 1;
        } else if (tag.type < 0) {
            length += provider.getSymbol(tag.type).length();
        } else {
            length += U16_LENGTH(tag.codePoint);
        }
    }
    return length;
}